

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void cmDebugger_impl::WatchMethodCB
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool matchesFilter;
  bool isUnset;
  bool isDefined;
  bool isWrite;
  bool isRead;
  cmDebugger_impl *debugger;
  element_type *watchpoint;
  ptr *watchpointPtr;
  cmMakefile *mf_local;
  char *newValue_local;
  void *client_data_local;
  int access_type_local;
  string *variable_local;
  
  if (((client_data != (void *)0x0) &&
      (peVar1 = std::__shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2> *)
                           client_data), peVar1 != (element_type *)0x0)) &&
     (peVar1->debugger != (cmDebugger_impl *)0x0)) {
    bVar2 = false;
    if ((uint)access_type < 2) {
      bVar2 = ((peVar1->super_cmWatchpoint).Type & WATCHPOINT_READ) != WATCHPOINT_NONE;
    }
    bVar3 = false;
    if (access_type == 3) {
      bVar3 = ((peVar1->super_cmWatchpoint).Type & WATCHPOINT_WRITE) != WATCHPOINT_NONE;
    }
    bVar4 = false;
    if (access_type == 2) {
      bVar4 = ((peVar1->super_cmWatchpoint).Type & WATCHPOINT_DEFINE) != WATCHPOINT_NONE;
    }
    bVar5 = false;
    if (access_type == 4) {
      bVar5 = ((peVar1->super_cmWatchpoint).Type & WATCHPOINT_UNDEFINED) != WATCHPOINT_NONE;
    }
    if (((bVar2 || bVar3) || bVar4) || bVar5) {
      OnWatchCallback(peVar1->debugger,variable,access_type,newValue);
    }
  }
  return;
}

Assistant:

static void WatchMethodCB(const std::string& variable, int access_type,
                            void* client_data, const char* newValue,
                            const cmMakefile* mf)
  {
    (void)mf;
    auto watchpointPtr = (Watchpoint::ptr*)client_data;
    if (watchpointPtr == CM_NULLPTR) {
      return;
    }

    auto watchpoint = watchpointPtr->get();
    if (watchpoint == CM_NULLPTR) {
      return;
    }

    auto debugger = watchpoint->debugger;
    if (debugger == CM_NULLPTR) {
      return;
    }

    bool isRead =
      (access_type == cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS) |
      (access_type == cmVariableWatch::VARIABLE_READ_ACCESS);
    bool isWrite = access_type == cmVariableWatch::VARIABLE_MODIFIED_ACCESS;
    bool isDefined =
      access_type == cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS;
    bool isUnset = access_type == cmVariableWatch::VARIABLE_REMOVED_ACCESS;

    bool matchesFilter =
      (isRead && watchpoint->Type & cmWatchpoint::WATCHPOINT_READ) |
      (isWrite && watchpoint->Type & cmWatchpoint::WATCHPOINT_WRITE) |
      (isDefined && watchpoint->Type & cmWatchpoint::WATCHPOINT_DEFINE) |
      (isUnset && watchpoint->Type & cmWatchpoint::WATCHPOINT_UNDEFINED);

    if (matchesFilter) {
      debugger->OnWatchCallback(variable, access_type, newValue);
    }
  }